

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  Option *in_RCX;
  void **in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int ret;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  int in_stack_00000168;
  int in_stack_0000016c;
  Mat *in_stack_00000170;
  Mat *in_stack_00000178;
  Mat *in_stack_00000180;
  Mat *in_stack_00000188;
  int in_stack_00000690;
  int in_stack_00000698;
  int in_stack_000006a0;
  int in_stack_000006a8;
  int in_stack_000006b0;
  int in_stack_000006b8;
  Mat *in_stack_000006c0;
  Option *in_stack_000006c8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  int _w;
  Mat *in_stack_fffffffffffffe20;
  Mat *in_stack_fffffffffffffe28;
  void **ppvVar3;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  DeconvolutionDepthWise *in_stack_fffffffffffffe38;
  void *local_158;
  int *local_150;
  void *local_148;
  undefined4 local_140;
  long *local_138;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  int local_120;
  void *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  undefined8 local_100;
  int local_f8;
  int local_f4;
  Option *local_f0;
  void **local_e8;
  int local_cc;
  void **local_c8;
  void **local_c0;
  int local_b0;
  undefined4 local_ac;
  void **local_a0;
  void **local_98;
  void **local_90;
  void **local_88;
  void **local_78;
  int local_60;
  undefined4 local_5c;
  void **local_58;
  void *local_50;
  void **local_38;
  void **local_30;
  
  local_f4 = *(int *)(in_RSI + 0x2c);
  local_f8 = *(int *)(in_RSI + 0x30);
  local_100 = *(undefined8 *)(in_RSI + 0x10);
  local_104 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_108 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_10c = (local_f4 + -1) * *(int *)(in_RDI + 0xe4) + local_104 + *(int *)(in_RDI + 0xfc);
  local_110 = (local_f8 + -1) * *(int *)(in_RDI + 0xe8) + local_108 + *(int *)(in_RDI + 0x100);
  local_c8 = &local_158;
  local_158 = (void *)0x0;
  local_150 = (int *)0x0;
  local_148 = (void *)0x0;
  local_140 = 0;
  local_138 = (long *)0x0;
  local_130 = 0;
  local_12c = 0;
  local_128 = 0;
  local_124 = 0;
  local_120 = 0;
  local_118 = (void *)0x0;
  _w = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_f0 = in_RCX;
  local_e8 = in_RDX;
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) &&
     ((*(int *)(in_RDI + 0xf8) < 1 &&
      ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))))) {
    local_a0 = &local_158;
    if (local_a0 != in_RDX) {
      if (in_RDX[1] != (void *)0x0) {
        piVar1 = (int *)in_RDX[1];
        local_ac = 1;
        LOCK();
        local_b0 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_158 = *in_RDX;
      local_150 = (int *)in_RDX[1];
      local_148 = in_RDX[2];
      local_140 = *(undefined4 *)(in_RDX + 3);
      local_138 = (long *)in_RDX[4];
      local_130 = *(undefined4 *)(in_RDX + 5);
      local_12c = *(undefined4 *)((long)in_RDX + 0x2c);
      local_128 = *(undefined4 *)(in_RDX + 6);
      local_124 = *(undefined4 *)((long)in_RDX + 0x34);
      local_120 = *(int *)(in_RDX + 7);
      local_118 = in_RDX[8];
      local_78 = local_a0;
    }
    local_98 = local_a0;
    Mat::create(in_stack_fffffffffffffe20,_w,(int)in_stack_fffffffffffffe18,
                in_stack_fffffffffffffe14,
                CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                (Allocator *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  else {
    Mat::create(in_stack_fffffffffffffe20,_w,(int)in_stack_fffffffffffffe18,
                in_stack_fffffffffffffe14,
                CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                (Allocator *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  local_88 = &local_158;
  if (local_158 != (void *)0x0) {
    local_38 = local_88;
  }
  if (local_158 != (void *)0x0 && (long)local_118 * (long)local_120 != 0) {
    local_cc = deconvolutiondepthwise
                         (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
                          in_stack_0000016c,in_stack_00000168,in_stack_00000690,in_stack_00000698,
                          in_stack_000006a0,in_stack_000006a8,in_stack_000006b0,in_stack_000006b8,
                          in_stack_000006c0,in_stack_000006c8);
    if (local_cc == 0) {
      cut_padding(in_stack_fffffffffffffe38,
                  (Mat *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                  in_stack_fffffffffffffe28,local_f0);
      local_90 = local_e8;
      bVar2 = true;
      if (*local_e8 != (void *)0x0) {
        local_30 = local_e8;
        bVar2 = (long)local_e8[8] * (long)*(int *)(local_e8 + 7) == 0;
      }
      if (bVar2) {
        local_cc = -100;
      }
      else {
        local_cc = 0;
      }
    }
  }
  else {
    local_cc = -100;
  }
  ppvVar3 = &local_158;
  if (local_150 != (int *)0x0) {
    local_5c = 0xffffffff;
    LOCK();
    local_60 = *local_150;
    *local_150 = *local_150 + -1;
    UNLOCK();
    if (local_60 == 1) {
      local_c0 = ppvVar3;
      local_58 = ppvVar3;
      if (local_138 == (long *)0x0) {
        local_50 = local_158;
        if (local_158 != (void *)0x0) {
          free(local_158);
        }
      }
      else {
        (**(code **)(*local_138 + 0x18))(local_138,local_158);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_cc;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}